

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O1

bool jbcoin::passesLocalChecks(STObject *st,string *reason)

{
  pointer pSVar1;
  SField *pSVar2;
  void *pvVar3;
  STObject *pSVar4;
  pointer pSVar5;
  bool bVar6;
  int iVar7;
  optional<unsigned_short> oVar8;
  STArray *this;
  byte *pbVar9;
  STBase **ppSVar10;
  uint uVar11;
  char *pcVar12;
  string *strSrc;
  char *pcVar13;
  ulong uVar14;
  STBase *pSVar15;
  pointer pSVar16;
  pointer pSVar17;
  pointer pSVar18;
  bool bVar19;
  Serializer s;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> data;
  Serializer local_98;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> local_80;
  STObject *local_60;
  pointer local_58;
  string local_50;
  
  bVar6 = STObject::isFieldPresent(st,(SField *)sfMemos);
  if (bVar6) {
    this = STObject::getFieldArray(st,(SField *)sfMemos);
    Serializer::Serializer(&local_98,0x800);
    STArray::add(this,&local_98);
    if ((int)local_98.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
        (int)local_98.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start < 0x401) {
      pSVar16 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar18 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar4 = st;
      pSVar5 = pSVar18;
      if (pSVar16 == pSVar18) {
        bVar6 = true;
      }
      else {
        do {
          local_58 = pSVar5;
          local_60 = pSVar4;
          if (((pSVar16->super_STBase).fName)->fieldCode == sfMemo) {
            pSVar1 = (pSVar16->v_).
                     super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pSVar17 = (pSVar16->v_).
                           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                           ._M_impl.super__Vector_impl_data._M_start; pSVar17 != pSVar1;
                pSVar17 = pSVar17 + 1) {
              pSVar2 = pSVar17->p_->fName;
              iVar7 = pSVar2->fieldCode;
              if (((iVar7 == sfMemoType) || (iVar7 == sfMemoData)) || (iVar7 == sfMemoFormat)) {
                strSrc = &local_50;
                (*pSVar17->p_->_vptr_STBase[6])(strSrc);
                strUnHex(&local_80,strSrc);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  strSrc = (string *)(local_50.field_2._M_allocated_capacity + 1);
                  operator_delete(local_50._M_dataplus._M_p,(ulong)strSrc);
                }
                if (local_80.second == false) {
                  iVar7 = 1;
                  std::__cxx11::string::_M_replace
                            ((ulong)reason,0,(char *)reason->_M_string_length,0x283a1a);
                }
                else {
                  iVar7 = 5;
                  if (pSVar2->fieldCode != sfMemoData) {
                    if (isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::allowedSymbols ==
                        '\0') {
                      pcVar13 = &isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::
                                 allowedSymbols;
                      iVar7 = __cxa_guard_acquire();
                      if (iVar7 != 0) {
                        isMemoOkay::anon_class_1_0_00000001::operator()
                                  ((array<char,_256UL> *)pcVar13,(anon_class_1_0_00000001 *)strSrc);
                        __cxa_guard_release(&isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)
                                             ::allowedSymbols);
                      }
                    }
                    iVar7 = 0;
                    for (pbVar9 = local_80.first.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        pbVar9 != local_80.first.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
                      if (isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::allowedSymbols
                          [*pbVar9] == '\0') {
                        iVar7 = 1;
                        std::__cxx11::string::_M_replace
                                  ((ulong)reason,0,(char *)reason->_M_string_length,0x283a6a);
                        break;
                      }
                    }
                  }
                }
                if (local_80.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start != (byte *)0x0) {
                  operator_delete(local_80.first.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_80.first.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_80.first.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                iVar7 = 1;
                std::__cxx11::string::_M_replace
                          ((ulong)reason,0,(char *)reason->_M_string_length,0x2839d9);
              }
              if ((iVar7 != 5) && (iVar7 != 0)) goto LAB_001bbbc4;
            }
            iVar7 = 4;
LAB_001bbbc4:
            pSVar18 = local_58;
            if (iVar7 == 4) {
              iVar7 = 0;
            }
          }
          else {
            std::__cxx11::string::_M_replace
                      ((ulong)reason,0,(char *)reason->_M_string_length,0x2839ad);
            iVar7 = 1;
          }
          if (iVar7 != 0) goto LAB_001bbbee;
          pSVar16 = pSVar16 + 1;
          pSVar4 = local_60;
          pSVar5 = local_58;
        } while (pSVar16 != pSVar18);
        iVar7 = 2;
LAB_001bbbee:
        bVar6 = iVar7 == 2;
        st = local_60;
      }
    }
    else {
      bVar6 = false;
      std::__cxx11::string::_M_replace((ulong)reason,0,(char *)reason->_M_string_length,0x283982);
    }
    pvVar3 = (void *)CONCAT44(local_98.mData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_98.mData.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_98.mData.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3
                     );
    }
    if (!bVar6) {
      return false;
    }
  }
  pSVar17 = (st->v_).
            super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(st->v_).
                       super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar17 >> 5) *
           -0x55555555;
  bVar6 = (int)uVar11 < 1;
  if (0 < (int)uVar11) {
    ppSVar10 = &pSVar17->p_;
    bVar6 = false;
    uVar14 = 1;
    do {
      pSVar15 = *ppSVar10;
      if ((pSVar15 == (STBase *)0x0) ||
         (pSVar15->_vptr_STBase != (_func_int **)&PTR__STBase_002d6e70)) {
        pSVar15 = (STBase *)0x0;
      }
      if ((pSVar15 != (STBase *)0x0) && (*(char *)((long)&pSVar15[2]._vptr_STBase + 4) != '\0'))
      break;
      bVar6 = (uVar11 & 0x7fffffff) <= uVar14;
      ppSVar10 = ppSVar10 + 0xc;
      bVar19 = uVar14 != (uVar11 & 0x7fffffff);
      uVar14 = uVar14 + 1;
    } while (bVar19);
  }
  if (bVar6) {
    local_80.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&sfTransactionType;
    oVar8 = STObject::operator[]<jbcoin::STInteger<unsigned_short>>
                      (st,(OptionaledField<jbcoin::STInteger<unsigned_short>_> *)&local_80);
    if (((uint)oVar8.super_type & 0xfffe0000) != 0x640000 ||
        (~oVar8.super_type.m_initialized & 1U) != 0) {
      return true;
    }
    pcVar13 = (char *)reason->_M_string_length;
    pcVar12 = "Cannot submit pseudo transactions.";
  }
  else {
    pcVar13 = (char *)reason->_M_string_length;
    pcVar12 = "An account field is invalid.";
  }
  std::__cxx11::string::_M_replace((ulong)reason,0,pcVar13,(ulong)pcVar12);
  return false;
}

Assistant:

bool passesLocalChecks (STObject const& st, std::string& reason)
{
    if (!isMemoOkay (st, reason))
        return false;

    if (!isAccountFieldOkay (st))
    {
        reason = "An account field is invalid.";
        return false;
    }

    if (isPseudoTx(st))
    {
        reason = "Cannot submit pseudo transactions.";
        return false;
    }
    return true;
}